

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O3

void ZSTD_DCtx_resetParameters(ZSTD_DCtx *dctx)

{
  if (dctx->streamStage == zdss_init) {
    dctx->format = ZSTD_f_zstd1;
    dctx->forceIgnoreChecksum = ZSTD_d_validateChecksum;
    dctx->maxWindowSize = 0x8000001;
    dctx->outBufferMode = ZSTD_bm_buffered;
    dctx->refMultipleDDicts = ZSTD_rmd_refSingleDDict;
    dctx->disableHufAsm = 0;
    return;
  }
  __assert_fail("dctx->streamStage == zdss_init",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress.c"
                ,0xf1,"void ZSTD_DCtx_resetParameters(ZSTD_DCtx *)");
}

Assistant:

static void ZSTD_DCtx_resetParameters(ZSTD_DCtx* dctx)
{
    assert(dctx->streamStage == zdss_init);
    dctx->format = ZSTD_f_zstd1;
    dctx->maxWindowSize = ZSTD_MAXWINDOWSIZE_DEFAULT;
    dctx->outBufferMode = ZSTD_bm_buffered;
    dctx->forceIgnoreChecksum = ZSTD_d_validateChecksum;
    dctx->refMultipleDDicts = ZSTD_rmd_refSingleDDict;
    dctx->disableHufAsm = 0;
}